

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::CSVBuffer::CSVBuffer
          (CSVBuffer *this,ClientContext *context,idx_t buffer_size_p,CSVFileHandle *file_handle,
          idx_t *global_csv_current_position)

{
  optional_ptr<duckdb::FileBuffer,_true> *this_00;
  data_ptr_t buffer;
  ulong uVar1;
  idx_t iVar2;
  
  this->last_buffer = false;
  this->context = context;
  this->requested_size = buffer_size_p;
  this->global_csv_start = 0;
  this->can_seek = file_handle->can_seek;
  this->is_pipe = file_handle->is_pipe;
  this->buffer_idx = 0;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->block).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BufferHandle::BufferHandle(&this->handle);
  AllocateBuffer(this,buffer_size_p);
  this_00 = &(this->handle).node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
  buffer = this_00->ptr->buffer;
  uVar1 = CSVFileHandle::Read(file_handle,buffer,buffer_size_p);
  while ((this->actual_buffer_size = uVar1, uVar1 < buffer_size_p &&
         (file_handle->finished == false))) {
    iVar2 = CSVFileHandle::Read(file_handle,buffer + uVar1,buffer_size_p - uVar1);
    uVar1 = iVar2 + this->actual_buffer_size;
  }
  this->global_csv_start = *global_csv_current_position;
  this->last_buffer = file_handle->finished;
  return;
}

Assistant:

CSVBuffer::CSVBuffer(ClientContext &context, idx_t buffer_size_p, CSVFileHandle &file_handle,
                     const idx_t &global_csv_current_position)
    : context(context), requested_size(buffer_size_p), can_seek(file_handle.CanSeek()), is_pipe(file_handle.IsPipe()) {
	AllocateBuffer(buffer_size_p);
	auto buffer = Ptr();
	actual_buffer_size = file_handle.Read(buffer, buffer_size_p);
	while (actual_buffer_size < buffer_size_p && !file_handle.FinishedReading()) {
		// We keep reading until this block is full
		actual_buffer_size += file_handle.Read(&buffer[actual_buffer_size], buffer_size_p - actual_buffer_size);
	}
	global_csv_start = global_csv_current_position;
	last_buffer = file_handle.FinishedReading();
}